

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

int mbedtls_sha1_self_test(int verbose)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uchar sha1sum [20];
  mbedtls_sha1_context ctx;
  uchar buf [1024];
  uchar local_4b8;
  uchar uStack_4b7;
  uchar uStack_4b6;
  uchar uStack_4b5;
  uchar uStack_4b4;
  uchar uStack_4b3;
  uchar uStack_4b2;
  uchar uStack_4b1;
  uchar uStack_4b0;
  uchar uStack_4af;
  uchar uStack_4ae;
  uchar uStack_4ad;
  uchar uStack_4ac;
  uchar uStack_4ab;
  uchar uStack_4aa;
  uchar uStack_4a9;
  undefined4 local_4a8;
  undefined1 local_498 [24];
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 auStack_458 [12];
  uchar local_44c [4];
  undefined1 auStack_448 [12];
  uchar local_438 [1032];
  
  auStack_448 = SUB1612((undefined1  [16])0x0,4);
  auStack_458 = SUB1612((undefined1  [16])0x0,0);
  local_44c[0] = '\0';
  local_44c[1] = '\0';
  local_44c[2] = '\0';
  local_44c[3] = '\0';
  local_468 = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  stack0xfffffffffffffb78 = (undefined1  [16])0x0;
  local_498._0_16_ = (undefined1  [16])0x0;
  lVar3 = 0;
  do {
    if (verbose != 0) {
      printf("  SHA-1 test #%d: ",(ulong)((int)lVar3 + 1));
    }
    local_498._0_16_ = ZEXT816(0xefcdab8967452301) << 0x40;
    uStack_480 = 0xc3d2e1f0;
    local_498._16_8_ = 0x1032547698badcfe;
    if (lVar3 == 2) {
      memset(local_438,0x61,1000);
      iVar2 = 1000;
      do {
        mbedtls_sha1_update_ret((mbedtls_sha1_context *)local_498,local_438,1000);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    else {
      mbedtls_sha1_update_ret
                ((mbedtls_sha1_context *)local_498,sha1_test_buf[lVar3],sha1_test_buflen[lVar3]);
    }
    mbedtls_sha1_finish_ret((mbedtls_sha1_context *)local_498,&local_4b8);
    uVar1 = *(undefined4 *)(sha1_test_sum[lVar3] + 0x10);
    auVar4[0] = -(sha1_test_sum[lVar3][0] == local_4b8);
    auVar4[1] = -(sha1_test_sum[lVar3][1] == uStack_4b7);
    auVar4[2] = -(sha1_test_sum[lVar3][2] == uStack_4b6);
    auVar4[3] = -(sha1_test_sum[lVar3][3] == uStack_4b5);
    auVar4[4] = -(sha1_test_sum[lVar3][4] == uStack_4b4);
    auVar4[5] = -(sha1_test_sum[lVar3][5] == uStack_4b3);
    auVar4[6] = -(sha1_test_sum[lVar3][6] == uStack_4b2);
    auVar4[7] = -(sha1_test_sum[lVar3][7] == uStack_4b1);
    auVar4[8] = -(sha1_test_sum[lVar3][8] == uStack_4b0);
    auVar4[9] = -(sha1_test_sum[lVar3][9] == uStack_4af);
    auVar4[10] = -(sha1_test_sum[lVar3][10] == uStack_4ae);
    auVar4[0xb] = -(sha1_test_sum[lVar3][0xb] == uStack_4ad);
    auVar4[0xc] = -(sha1_test_sum[lVar3][0xc] == uStack_4ac);
    auVar4[0xd] = -(sha1_test_sum[lVar3][0xd] == uStack_4ab);
    auVar4[0xe] = -(sha1_test_sum[lVar3][0xe] == uStack_4aa);
    auVar4[0xf] = -(sha1_test_sum[lVar3][0xf] == uStack_4a9);
    auVar5[0] = -((char)uVar1 == (char)local_4a8);
    auVar5[1] = -((char)((uint)uVar1 >> 8) == (char)((uint)local_4a8 >> 8));
    auVar5[2] = -((char)((uint)uVar1 >> 0x10) == (char)((uint)local_4a8 >> 0x10));
    auVar5[3] = -((char)((uint)uVar1 >> 0x18) == (char)((uint)local_4a8 >> 0x18));
    auVar5[4] = 0xff;
    auVar5[5] = 0xff;
    auVar5[6] = 0xff;
    auVar5[7] = 0xff;
    auVar5[8] = 0xff;
    auVar5[9] = 0xff;
    auVar5[10] = 0xff;
    auVar5[0xb] = 0xff;
    auVar5[0xc] = 0xff;
    auVar5[0xd] = 0xff;
    auVar5[0xe] = 0xff;
    auVar5[0xf] = 0xff;
    auVar4 = auVar4 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) {
      iVar2 = 1;
      if (verbose != 0) {
        puts("failed");
      }
      goto LAB_001139d2;
    }
    if (verbose != 0) {
      puts("passed");
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  iVar2 = 0;
  if (verbose != 0) {
    putchar(10);
    iVar2 = 0;
  }
LAB_001139d2:
  lVar3 = 0;
  do {
    local_498[lVar3] = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x5c);
  return iVar2;
}

Assistant:

int mbedtls_sha1_self_test( int verbose )
{
    int i, j, buflen, ret = 0;
    unsigned char buf[1024];
    unsigned char sha1sum[20];
    mbedtls_sha1_context ctx;

    mbedtls_sha1_init( &ctx );

    /*
     * SHA-1
     */
    for( i = 0; i < 3; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  SHA-1 test #%d: ", i + 1 );

        if( ( ret = mbedtls_sha1_starts_ret( &ctx ) ) != 0 )
            goto fail;

        if( i == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
            {
                ret = mbedtls_sha1_update_ret( &ctx, buf, buflen );
                if( ret != 0 )
                    goto fail;
            }
        }
        else
        {
            ret = mbedtls_sha1_update_ret( &ctx, sha1_test_buf[i],
                                           sha1_test_buflen[i] );
            if( ret != 0 )
                goto fail;
        }

        if( ( ret = mbedtls_sha1_finish_ret( &ctx, sha1sum ) ) != 0 )
            goto fail;

        if( memcmp( sha1sum, sha1_test_sum[i], 20 ) != 0 )
        {
            ret = 1;
            goto fail;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    goto exit;

fail:
    if( verbose != 0 )
        mbedtls_printf( "failed\n" );

exit:
    mbedtls_sha1_free( &ctx );

    return( ret );
}